

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64.h
# Opt level: O2

void __thiscall
PMP_Multilinear_Hasher_64::randomize
          (PMP_Multilinear_Hasher_64 *this,UniformRandomNumberGenerator *rng)

{
  uint64_t *puVar1;
  random_data_for_PMPML_64 *prVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  random_data_for_PMPML_64 *prVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  
  prVar6 = (random_data_for_PMPML_64 *)operator_new__(0x2100,0x20);
  lVar8 = 0;
  do {
    if (lVar8 == 8) {
      for (lVar8 = 0; lVar8 != 0x2100; lVar8 = lVar8 + 0x420) {
        uVar4 = (*(code *)**(undefined8 **)rng)(rng);
        uVar5 = (*(code *)**(undefined8 **)rng)(rng);
        *(ulong *)((long)prVar6->random_coeff + lVar8 + -0x20) = CONCAT44(uVar4,uVar5);
      }
      prVar2 = this->curr_rd;
      if (prVar2 != (random_data_for_PMPML_64 *)0x0 && prVar2 != rd_for_PMPML_64) {
        operator_delete__(prVar2,0x20);
      }
      this->curr_rd = prVar6;
      return;
    }
    puVar1 = &prVar6[lVar8].cachedSumLow;
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 1) {
      *puVar1 = 0;
      puVar1[1] = 0;
      do {
        while( true ) {
          uVar3 = (*(code *)**(undefined8 **)rng)(rng);
          prVar6[lVar8].random_coeff[lVar9] = (ulong)uVar3 << 0x20;
          uVar4 = (*(code *)**(undefined8 **)rng)(rng);
          uVar7 = CONCAT44(uVar3,uVar4);
          prVar6[lVar8].random_coeff[lVar9] = uVar7;
          if (lVar8 == 0) break;
          if (uVar7 - 1 < 0xfffffffffffffff4) goto LAB_0017ac1a;
        }
      } while (uVar7 == 0);
LAB_0017ac1a:
      *puVar1 = uVar7;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void randomize( UniformRandomNumberGenerator& rng )
  {
    random_data_for_PMPML_64 * temp_curr_rd = new random_data_for_PMPML_64[ PMPML_LEVELS_64 ];

	int i, j;
	for ( i=0; i<PMPML_LEVELS_64; i++ )
	{
		for ( j=0; j<PMPML_CHUNK_SIZE_64; j++ )
		{
			temp_curr_rd[ i ].cachedSumLow = 0;
			temp_curr_rd[ i ].cachedSumHigh = 0;
			do
			{
				temp_curr_rd[ i ].random_coeff[ j ] = rng.rand();
				temp_curr_rd[ i ].random_coeff[ j ] <<= 32;
				temp_curr_rd[ i ].random_coeff[ j ] |= rng.rand();
			}
			while ( !IS_VALID_COEFFICIENT_64( temp_curr_rd[ i ].random_coeff[ j ], i ) );
			uint64_t csl = temp_curr_rd[ i ].cachedSumLow;
			temp_curr_rd[ i ].cachedSumLow += temp_curr_rd[ i ].random_coeff[ j ];
			if ( temp_curr_rd[ i ].cachedSumLow < csl )
				temp_curr_rd[ i ].cachedSumHigh += 1;
		}
	}

	for ( i=0; i<PMPML_LEVELS_64; i++ )
	{
		uint64_t rv = rng.rand();
		rv <<= 32;
		rv += rng.rand();
		temp_curr_rd[ i ].const_term = rv;
	}

	if ( curr_rd == rd_for_PMPML_64 )
		curr_rd = temp_curr_rd;
	else
	{
		if ( curr_rd != NULL )
			delete [] curr_rd;
		curr_rd = temp_curr_rd;
	}
  }